

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_info(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  byte *pbVar1;
  int *piVar2;
  int iVar3;
  uint8_t *puVar4;
  char *__ptr;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  bcf_info_t *pbVar8;
  long lVar9;
  ulong uVar10;
  kstring_t str;
  
  uVar5 = bcf_hdr_id2int(hdr,0,key);
  if ((int)uVar5 < 0) {
    return -1;
  }
  if ((~(hdr->id[0][uVar5].val)->info[1] & 0xf) == 0) {
    return -1;
  }
  if ((line->unpacked & 4) == 0) {
    bcf_unpack(line,4);
  }
  pbVar8 = (bcf_info_t *)0x0;
  for (lVar9 = 0; (ulong)*(ushort *)&line->field_0x10 << 5 != lVar9; lVar9 = lVar9 + 0x20) {
    if (uVar5 == *(uint *)((long)&((line->d).info)->key + lVar9)) {
      if ((uint)*(ushort *)&line->field_0x10 << 5 == (int)lVar9) {
        pbVar8 = (bcf_info_t *)0x0;
      }
      else {
        pbVar8 = (bcf_info_t *)((long)&((line->d).info)->key + lVar9);
      }
      break;
    }
  }
  if ((n == 0) || (values == (void *)0x0 && type == 3)) {
    if (pbVar8 == (bcf_info_t *)0x0) {
      return 0;
    }
    if ((int)*(uint *)&pbVar8->field_0x1c < 0) {
      free(pbVar8->vptr + -(ulong)(*(uint *)&pbVar8->field_0x1c & 0x7fffffff));
      pbVar8->field_0x1f = pbVar8->field_0x1f & 0x7f;
    }
    piVar2 = &(line->d).shared_dirty;
    *(byte *)piVar2 = (byte)*piVar2 | 8;
    pbVar8->vptr = (uint8_t *)0x0;
    return 0;
  }
  str.l = 0;
  str.m = 0;
  str.s = (char *)0x0;
  bcf_enc_int1(&str,uVar5);
  switch(type) {
  case 0:
  case 3:
    if (values == (void *)0x0) {
      bcf_enc_size(&str,0,0);
    }
    else {
      sVar7 = strlen((char *)values);
      bcf_enc_vchar(&str,(int)sVar7,(char *)values);
    }
    break;
  case 1:
    bcf_enc_vint(&str,n,(int32_t *)values,-1);
    break;
  case 2:
    bcf_enc_vfloat(&str,n,(float *)values);
    break;
  default:
    fprintf(_stderr,"[E::%s] the type %d not implemented yet\n","bcf_update_info",(ulong)(uint)type)
    ;
    abort();
  }
  __ptr = str.s;
  if (pbVar8 == (bcf_info_t *)0x0) {
    uVar5 = *(int *)&line->field_0x10 + 1;
    uVar6 = uVar5 & 0xffff;
    *(short *)&line->field_0x10 = (short)uVar5;
    iVar3 = (line->d).m_info;
    pbVar8 = (line->d).info;
    if (iVar3 < (int)uVar6) {
      uVar5 = (int)(uVar6 - 1) >> 1 | uVar6 - 1;
      uVar5 = (int)uVar5 >> 2 | uVar5;
      uVar5 = (int)uVar5 >> 4 | uVar5;
      uVar5 = (int)uVar5 >> 8 | uVar5;
      uVar5 = (int)uVar5 >> 0x10 | uVar5;
      (line->d).m_info = uVar5 + 1;
      pbVar8 = (bcf_info_t *)realloc(pbVar8,(long)(int)uVar5 * 0x20 + 0x20);
      (line->d).info = pbVar8;
      memset(pbVar8 + iVar3,0,((long)(line->d).m_info - (long)iVar3) * 0x20);
      uVar6 = (uint)*(ushort *)&line->field_0x10;
    }
    bcf_unpack_info_core1
              ((uint8_t *)str.s,(bcf_info_t *)((long)&pbVar8[-1].key + (ulong)(uVar6 << 5)));
    pbVar1 = (byte *)((long)pbVar8 + ((ulong)(uVar6 << 5) - 1));
    *pbVar1 = *pbVar1 | 0x80;
  }
  else {
    uVar5 = *(uint *)&pbVar8->field_0x1c & 0x7fffffff;
    uVar10 = (ulong)(pbVar8->vptr_len + uVar5);
    if (str.l <= uVar10) {
      if (str.l != uVar10) {
        piVar2 = &(line->d).shared_dirty;
        *(byte *)piVar2 = (byte)*piVar2 | 8;
        uVar5 = *(uint *)&pbVar8->field_0x1c & 0x7fffffff;
      }
      puVar4 = pbVar8->vptr;
      memcpy(puVar4 + -(ulong)uVar5,str.s,str.l);
      free(__ptr);
      uVar6 = *(uint *)&pbVar8->field_0x1c;
      bcf_unpack_info_core1(puVar4 + -(ulong)uVar5,pbVar8);
      *(uint *)&pbVar8->field_0x1c = *(uint *)&pbVar8->field_0x1c & 0x7fffffff | uVar6 & 0x80000000;
      goto LAB_00118393;
    }
    if ((int)*(uint *)&pbVar8->field_0x1c < 0) {
      __assert_fail("!inf->vptr_free",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0xa95,
                    "int bcf_update_info(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                   );
    }
    bcf_unpack_info_core1((uint8_t *)str.s,pbVar8);
    pbVar8->field_0x1f = pbVar8->field_0x1f | 0x80;
  }
  piVar2 = &(line->d).shared_dirty;
  *(byte *)piVar2 = (byte)*piVar2 | 8;
LAB_00118393:
  *(byte *)&line->unpacked = (byte)line->unpacked | 4;
  return 0;
}

Assistant:

int bcf_update_info(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, inf_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,inf_id) ) return -1;    // No such INFO field in the header
    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( inf_id==line->d.info[i].key ) break;
    bcf_info_t *inf = i==line->n_info ? NULL : &line->d.info[i];

    if ( !n || (type==BCF_HT_STR && !values) )
    {
        if ( inf )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( inf->vptr_free )
            {
                free(inf->vptr - inf->vptr_off);
                inf->vptr_free = 0;
            }
            line->d.shared_dirty |= BCF1_DIRTY_INF;
            inf->vptr = NULL;
        }
        return 0;
    }

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, inf_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, -1);
    else if ( type==BCF_HT_REAL )
        bcf_enc_vfloat(&str, n, (float*)values);
    else if ( type==BCF_HT_FLAG || type==BCF_HT_STR )
    {
        if ( values==NULL )
            bcf_enc_size(&str, 0, BCF_BT_NULL);
        else
            bcf_enc_vchar(&str, strlen((char*)values), (char*)values);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    // Is the INFO tag already present
    if ( inf )
    {
        // Is it big enough to accommodate new block?
        if ( str.l <= inf->vptr_len + inf->vptr_off )
        {
            if ( str.l != inf->vptr_len + inf->vptr_off ) line->d.shared_dirty |= BCF1_DIRTY_INF;
            uint8_t *ptr = inf->vptr - inf->vptr_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int vptr_free = inf->vptr_free;
            bcf_unpack_info_core1(ptr, inf);
            inf->vptr_free = vptr_free;
        }
        else
        {
            assert( !inf->vptr_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_info_core1((uint8_t*)str.s, inf);
            inf->vptr_free = 1;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }
    else
    {
        // The tag is not present, create new one
        line->n_info++;
        hts_expand0(bcf_info_t, line->n_info, line->d.m_info , line->d.info);
        inf = &line->d.info[line->n_info-1];
        bcf_unpack_info_core1((uint8_t*)str.s, inf);
        inf->vptr_free = 1;
        line->d.shared_dirty |= BCF1_DIRTY_INF;
    }
    line->unpacked |= BCF_UN_INFO;
    return 0;
}